

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::call_matcher<int(int),std::tuple<trompeloeil::wildcard>>::
set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
          (call_matcher<int(int),std::tuple<trompeloeil::wildcard>> *this,
          pair<const_char_*,_trompeloeil::sequence_&> *t)

{
  long *plVar1;
  _func_int **pp_Var2;
  _func_int **in_RAX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  std::
  make_unique<trompeloeil::sequence_handler<1ul>,trompeloeil::sequence_handler_base&,char_const*&,trompeloeil::location&,std::pair<char_const*,trompeloeil::sequence&>>
            ((sequence_handler_base *)&stack0xffffffffffffffe8,*(char ***)(this + 0x70),
             (location *)(this + 0x28),(pair<const_char_*,_trompeloeil::sequence_&> *)(this + 0x18))
  ;
  pp_Var2 = local_18;
  local_18 = (_func_int **)0x0;
  plVar1 = *(long **)(this + 0x70);
  *(_func_int ***)(this + 0x70) = pp_Var2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    if (local_18 != (_func_int **)0x0) {
      (**(code **)(*local_18 + 8))();
    }
  }
  return;
}

Assistant:

void
    set_sequence(
      T&& ... t)
    {
      using handler = sequence_handler<sizeof...(T)>;
      auto seq = detail::make_unique<handler>(*sequences,
                                              name,
                                              loc,
                                              std::forward<T>(t)...);
      sequences = std::move(seq);
    }